

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall
pugi::impl::anon_unknown_0::document_order_comparator::operator()
          (document_order_comparator *this,xpath_node *lhs,xpath_node *rhs)

{
  xml_attribute_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  void *pvVar4;
  void *pvVar5;
  xml_node xVar6;
  xml_node xVar7;
  xml_node xVar8;
  xml_node_struct *pxVar9;
  xml_node_struct *rn;
  xml_node_struct *ln;
  xml_attribute local_30;
  
  pvVar4 = document_buffer_order((xpath_node *)this);
  pvVar5 = document_buffer_order(lhs);
  if (pvVar5 != (void *)0x0 && pvVar4 != (void *)0x0) {
    return pvVar4 < pvVar5;
  }
  xVar6 = xpath_node::node((xpath_node *)this);
  xVar7 = xpath_node::node(lhs);
  pxVar1 = (lhs->_attribute)._attr;
  if (*(long *)(this + 8) == 0) {
    if (pxVar1 != (xml_attribute_struct *)0x0) {
      xVar7 = xpath_node::parent(lhs);
      xVar8 = xpath_node::node((xpath_node *)this);
      if (xVar7._root == xVar8._root) {
        return true;
      }
      goto LAB_001a889d;
    }
  }
  else {
    xVar6 = xpath_node::parent((xpath_node *)this);
    if (pxVar1 == (xml_attribute_struct *)0x0) {
      xVar8 = xpath_node::node(lhs);
      if (xVar6._root == xVar8._root) {
        return false;
      }
      xVar6 = xpath_node::parent((xpath_node *)this);
    }
    else {
      xVar7 = xpath_node::parent(lhs);
      if (xVar6._root == xVar7._root) {
        local_30._attr = *(xml_attribute_struct **)(this + 8);
        while ((local_30._attr != (xml_attribute_struct *)0x0 &&
               (local_30._attr != (lhs->_attribute)._attr))) {
          local_30 = xml_attribute::next_attribute(&local_30);
        }
        return local_30._attr != (xml_attribute_struct *)0x0;
      }
      xVar6 = xpath_node::parent((xpath_node *)this);
LAB_001a889d:
      xVar7 = xpath_node::parent(lhs);
    }
  }
  if (xVar6._root == xVar7._root) {
    return false;
  }
  pxVar9 = xVar6._root;
  pxVar2 = xVar7._root;
  if (xVar7._root == (xml_node_struct *)0x0 || xVar6._root == (xml_node_struct *)0x0) {
    return xVar6._root < xVar7._root;
  }
  do {
    rn = pxVar2;
    ln = pxVar9;
    pxVar9 = ln;
    if ((ln == (xml_node_struct *)0x0) || (rn == (xml_node_struct *)0x0)) goto LAB_001a893a;
    pxVar9 = ln->parent;
    pxVar2 = rn->parent;
  } while (ln->parent != rn->parent);
LAB_001a8974:
  bVar3 = node_is_before_sibling(ln,rn);
  return bVar3;
LAB_001a893a:
  for (; pxVar9 != (xml_node_struct *)0x0; pxVar9 = pxVar9->parent) {
    xVar6._root = (xVar6._root)->parent;
  }
  for (; rn != (xml_node_struct *)0x0; rn = rn->parent) {
    xVar7._root = (xVar7._root)->parent;
  }
  if (xVar6._root == xVar7._root) {
    return ln == (xml_node_struct *)0x0;
  }
  do {
    rn = xVar7._root;
    ln = xVar6._root;
    xVar6._root = ln->parent;
    xVar7._root = rn->parent;
  } while (ln->parent != rn->parent);
  goto LAB_001a8974;
}

Assistant:

bool operator()(const xpath_node& lhs, const xpath_node& rhs) const
		{
			// optimized document order based check
			const void* lo = document_buffer_order(lhs);
			const void* ro = document_buffer_order(rhs);

			if (lo && ro) return lo < ro;

			// slow comparison
			xml_node ln = lhs.node(), rn = rhs.node();

			// compare attributes
			if (lhs.attribute() && rhs.attribute())
			{
				// shared parent
				if (lhs.parent() == rhs.parent())
				{
					// determine sibling order
					for (xml_attribute a = lhs.attribute(); a; a = a.next_attribute())
						if (a == rhs.attribute())
							return true;

					return false;
				}

				// compare attribute parents
				ln = lhs.parent();
				rn = rhs.parent();
			}
			else if (lhs.attribute())
			{
				// attributes go after the parent element
				if (lhs.parent() == rhs.node()) return false;

				ln = lhs.parent();
			}
			else if (rhs.attribute())
			{
				// attributes go after the parent element
				if (rhs.parent() == lhs.node()) return true;

				rn = rhs.parent();
			}

			if (ln == rn) return false;

			if (!ln || !rn) return ln < rn;

			return node_is_before(ln.internal_object(), rn.internal_object());
		}